

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv4Transmitter::DeleteDestination(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  ushort uVar1;
  uint uVar2;
  HashElement *pHVar3;
  RTPMemoryManager *pRVar4;
  bool bVar5;
  int iVar6;
  HashElement *pHVar7;
  HashElement *pHVar8;
  bool bVar9;
  
  if (this->init != true) {
    return -0x5a;
  }
  if (this->created != true) {
    return -0x59;
  }
  if (addr->addresstype != IPv4Address) {
    return -0x54;
  }
  uVar1 = *(ushort *)&addr[1]._vptr_RTPAddress;
  uVar2 = *(uint *)&addr->field_0xc;
  pHVar8 = (this->destinations).table[uVar2 % 0x207d];
  (this->destinations).curhashelem = pHVar8;
  bVar5 = false;
  do {
    pHVar7 = pHVar8;
    if (pHVar7 == (HashElement *)0x0) {
      iVar6 = -5;
      goto LAB_001218ee;
    }
    if (((pHVar7->element).rtpaddr.sin_addr.s_addr !=
         (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)) ||
       (pHVar8 = pHVar7, bVar9 = true,
       (pHVar7->element).rtpaddr.sin_port != (in_port_t)(uVar1 << 8 | uVar1 >> 8))) {
      pHVar8 = pHVar7->hashnext;
      (this->destinations).curhashelem = pHVar8;
      bVar9 = bVar5;
    }
    bVar5 = bVar9;
  } while (!bVar9);
  iVar6 = 0;
LAB_001218ee:
  if (pHVar7 == (HashElement *)0x0) {
    return iVar6;
  }
  pHVar8 = (this->destinations).curhashelem;
  if (pHVar8 == (HashElement *)0x0) {
    return -7;
  }
  pHVar7 = pHVar8->hashprev;
  pHVar3 = pHVar8->hashnext;
  if (pHVar7 == (HashElement *)0x0) {
    (this->destinations).table[pHVar8->hashindex] = pHVar3;
    if (pHVar3 == (HashElement *)0x0) goto LAB_00121931;
    pHVar7 = (HashElement *)0x0;
  }
  else {
    pHVar7->hashnext = pHVar3;
    if (pHVar3 == (HashElement *)0x0) goto LAB_00121931;
  }
  pHVar3->hashprev = pHVar7;
LAB_00121931:
  pHVar8 = (this->destinations).curhashelem;
  pHVar7 = pHVar8->listprev;
  pHVar3 = pHVar8->listnext;
  if (pHVar7 == (HashElement *)0x0) {
    (this->destinations).firsthashelem = pHVar3;
    if (pHVar3 == (HashElement *)0x0) {
      (this->destinations).lasthashelem = (HashElement *)0x0;
    }
    else {
      pHVar3->listprev = (HashElement *)0x0;
    }
  }
  else {
    pHVar7->listnext = pHVar3;
    if (pHVar3 == (HashElement *)0x0) {
      (this->destinations).lasthashelem = pHVar7;
    }
    else {
      pHVar3->listprev = pHVar7;
    }
  }
  pRVar4 = (this->destinations).super_RTPMemoryObject.mgr;
  if (pRVar4 == (RTPMemoryManager *)0x0) {
    if (pHVar8 != (HashElement *)0x0) {
      operator_delete(pHVar8,0x48);
    }
  }
  else {
    (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,pHVar8);
  }
  (this->destinations).curhashelem = pHVar3;
  return 0;
}

Assistant:

int RTPUDPv4Transmitter::DeleteDestination(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	RTPIPv4Destination dest;
	if (!RTPIPv4Destination::AddressToDestination(addr, dest))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_INVALIDADDRESSTYPE;
	}
	
	int status = destinations.DeleteElement(dest);
	
	MAINMUTEX_UNLOCK
	return status;
}